

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

Matrix33<float> * __thiscall
Imath_2_5::Matrix33<float>::gjInverse(Matrix33<float> *this,bool singExc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float *pfVar5;
  SingMatrixExc *pSVar6;
  byte in_DL;
  Matrix33<float> *in_RDI;
  float f_1;
  float f;
  float tmp_1;
  float tmp;
  float pivotsize;
  int pivot;
  Matrix33<float> t;
  Matrix33<float> s;
  int k;
  int j;
  int i;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  float local_74;
  float local_70;
  int local_6c;
  Matrix33<float> local_68;
  Matrix33<float> local_44;
  int local_20;
  int local_1c;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  Matrix33((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  Matrix33((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
           (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    local_6c = local_18;
    pfVar5 = operator[](&local_68,local_18);
    local_70 = pfVar5[local_18];
    local_1c = local_18;
    if (local_70 < 0.0) {
      local_70 = -local_70;
    }
    while (local_1c = local_1c + 1, local_1c < 3) {
      pfVar5 = operator[](&local_68,local_1c);
      local_74 = pfVar5[local_18];
      if (local_74 < 0.0) {
        local_74 = -local_74;
      }
      if (local_70 < local_74) {
        local_6c = local_1c;
        local_70 = local_74;
      }
    }
    if ((local_70 == 0.0) && (!NAN(local_70))) {
      if ((local_11 & 1) == 0) {
        Matrix33((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        return in_RDI;
      }
      pSVar6 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
      Imath_2_5::SingMatrixExc::SingMatrixExc(pSVar6,"Cannot invert singular matrix.");
      __cxa_throw(pSVar6,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
    }
    iVar4 = local_18;
    if (local_6c != local_18) {
      for (local_1c = 0; iVar4 = local_18, local_1c < 3; local_1c = local_1c + 1) {
        pfVar5 = operator[](&local_68,local_18);
        fVar1 = pfVar5[local_1c];
        pfVar5 = operator[](&local_68,local_6c);
        fVar2 = pfVar5[local_1c];
        pfVar5 = operator[](&local_68,local_18);
        pfVar5[local_1c] = fVar2;
        pfVar5 = operator[](&local_68,local_6c);
        pfVar5[local_1c] = fVar1;
        pfVar5 = operator[](&local_44,local_18);
        fVar1 = pfVar5[local_1c];
        pfVar5 = operator[](&local_44,local_6c);
        fVar2 = pfVar5[local_1c];
        pfVar5 = operator[](&local_44,local_18);
        pfVar5[local_1c] = fVar2;
        pfVar5 = operator[](&local_44,local_6c);
        pfVar5[local_1c] = fVar1;
      }
    }
    while (local_1c = iVar4 + 1, local_1c < 3) {
      pfVar5 = operator[](&local_68,local_1c);
      fVar1 = pfVar5[local_18];
      pfVar5 = operator[](&local_68,local_18);
      fVar2 = pfVar5[local_18];
      for (local_20 = 0; iVar4 = local_1c, local_20 < 3; local_20 = local_20 + 1) {
        pfVar5 = operator[](&local_68,local_18);
        fVar3 = pfVar5[local_20];
        pfVar5 = operator[](&local_68,local_1c);
        pfVar5[local_20] = -(fVar1 / fVar2) * fVar3 + pfVar5[local_20];
        pfVar5 = operator[](&local_44,local_18);
        fVar3 = pfVar5[local_20];
        pfVar5 = operator[](&local_44,local_1c);
        pfVar5[local_20] = -(fVar1 / fVar2) * fVar3 + pfVar5[local_20];
      }
    }
  }
  local_18 = 2;
  while( true ) {
    if (local_18 < 0) {
      Matrix33((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      return in_RDI;
    }
    pfVar5 = operator[](&local_68,local_18);
    fVar1 = pfVar5[local_18];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
    for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
      pfVar5 = operator[](&local_68,local_18);
      pfVar5[local_1c] = pfVar5[local_1c] / fVar1;
      pfVar5 = operator[](&local_44,local_18);
      pfVar5[local_1c] = pfVar5[local_1c] / fVar1;
    }
    for (local_1c = 0; local_1c < local_18; local_1c = local_1c + 1) {
      pfVar5 = operator[](&local_68,local_1c);
      fVar1 = pfVar5[local_18];
      for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
        in_stack_ffffffffffffff18 = fVar1;
        pfVar5 = operator[](&local_68,local_18);
        in_stack_ffffffffffffff1c = pfVar5[local_20];
        pfVar5 = operator[](&local_68,local_1c);
        pfVar5[local_20] = -in_stack_ffffffffffffff18 * in_stack_ffffffffffffff1c + pfVar5[local_20]
        ;
        in_stack_ffffffffffffff20 = fVar1;
        pfVar5 = operator[](&local_44,local_18);
        in_stack_ffffffffffffff24 = pfVar5[local_20];
        pfVar5 = operator[](&local_44,local_1c);
        pfVar5[local_20] = -in_stack_ffffffffffffff20 * in_stack_ffffffffffffff24 + pfVar5[local_20]
        ;
      }
    }
    local_18 = local_18 + -1;
  }
  if ((local_11 & 1) == 0) {
    Matrix33((Matrix33<float> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    return in_RDI;
  }
  pSVar6 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
  Imath_2_5::SingMatrixExc::SingMatrixExc(pSVar6,"Cannot invert singular matrix.");
  __cxa_throw(pSVar6,&SingMatrixExc::typeinfo,Imath_2_5::SingMatrixExc::~SingMatrixExc);
}

Assistant:

Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        for (j = 0; j < 3; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}